

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcStyledItem::~IfcStyledItem(IfcStyledItem *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].field_0x78 = &PTR__IfcStyledItem_00835070;
  *(undefined ***)((long)&(this->Name).ptr.field_2 + 8) = &PTR__IfcStyledItem_008350c0;
  *(undefined ***)this = &PTR__IfcStyledItem_00835098;
  if ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      *(undefined1 **)&this->field_0x38 != &this->Name) {
    operator_delete(*(undefined1 **)&this->field_0x38,(ulong)((this->Name).ptr._M_dataplus._M_p + 1)
                   );
  }
  pvVar1 = *(void **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>
                                     ).field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].field_0x78,0x88);
  return;
}

Assistant:

IfcStyledItem() : Object("IfcStyledItem") {}